

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_layer.cpp
# Opt level: O0

bool __thiscall
ON_Layer::UpdateReferencedComponents
          (ON_Layer *this,ON_ComponentManifest *source_manifest,
          ON_ComponentManifest *destination_manifest,ON_ManifestMap *manifest_map)

{
  bool bVar1;
  ON_ComponentManifestItem *this_00;
  ON_UUID OVar2;
  uchar local_7c [8];
  uchar local_74 [8];
  undefined1 local_5c [8];
  ON_UUID manifest_item_id;
  ON_UUID parent_layer_id;
  int destination_line_pattern_index;
  int line_pattern_index;
  int destination_material_index;
  int material_index;
  bool rc;
  ON_ManifestMap *manifest_map_local;
  ON_ComponentManifest *destination_manifest_local;
  ON_ComponentManifest *source_manifest_local;
  ON_Layer *this_local;
  
  destination_material_index._3_1_ = 1;
  _material_index = manifest_map;
  manifest_map_local = (ON_ManifestMap *)destination_manifest;
  destination_manifest_local = source_manifest;
  source_manifest_local = (ON_ComponentManifest *)this;
  line_pattern_index = RenderMaterialIndex(this);
  if (-1 < line_pattern_index) {
    destination_line_pattern_index = -0x7fffffff;
    bVar1 = ON_ManifestMap::GetAndValidateDestinationIndex
                      (_material_index,Material,line_pattern_index,
                       (ON_ComponentManifest *)manifest_map_local,&destination_line_pattern_index);
    if (bVar1) {
      line_pattern_index = destination_line_pattern_index;
    }
    else {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_layer.cpp"
                 ,0x6a,"","Unable to update render material reference.");
      destination_material_index._3_1_ = 0;
      line_pattern_index = RenderMaterialIndex(&Default);
    }
    SetRenderMaterialIndex(this,line_pattern_index);
  }
  parent_layer_id.Data4._4_4_ = LinetypeIndex(this);
  if (-1 < (int)parent_layer_id.Data4._4_4_) {
    parent_layer_id.Data4[0] = '\x01';
    parent_layer_id.Data4[1] = '\0';
    parent_layer_id.Data4[2] = '\0';
    parent_layer_id.Data4[3] = 0x80;
    bVar1 = ON_ManifestMap::GetAndValidateDestinationIndex
                      (_material_index,LinePattern,parent_layer_id.Data4._4_4_,
                       (ON_ComponentManifest *)manifest_map_local,(int *)parent_layer_id.Data4);
    if (bVar1) {
      parent_layer_id.Data4[4] = parent_layer_id.Data4[0];
      parent_layer_id.Data4[5] = parent_layer_id.Data4[1];
      parent_layer_id.Data4[6] = parent_layer_id.Data4[2];
      parent_layer_id.Data4[7] = parent_layer_id.Data4[3];
    }
    else {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_layer.cpp"
                 ,0x80,"","Unable to update line pattern reference.");
      destination_material_index._3_1_ = 0;
      parent_layer_id.Data4._4_4_ = LinetypeIndex(&Default);
    }
    SetLinetypeIndex(this,parent_layer_id.Data4._4_4_);
  }
  join_0x00000010_0x00000000_ = ParentLayerId(this);
  bVar1 = ::operator!=(&ON_nil_uuid,(ON_UUID_struct *)manifest_item_id.Data4);
  if (bVar1) {
    this_00 = ON_ComponentManifest::ItemFromId
                        ((ON_ComponentManifest *)manifest_map_local,Layer,stack0xffffffffffffffb4);
    _local_5c = ON_ComponentManifestItem::Id(this_00);
    bVar1 = ::operator==(&ON_nil_uuid,(ON_UUID_struct *)local_5c);
    OVar2 = _local_5c;
    if (bVar1) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_layer.cpp"
                 ,0x91,"","Unable to update parent layer id reference.");
      destination_material_index._3_1_ = 0;
      OVar2 = ParentLayerId(&Default);
      local_7c = OVar2._0_8_;
      local_74 = OVar2.Data4;
      manifest_item_id.Data4[0] = local_7c[0];
      manifest_item_id.Data4[1] = local_7c[1];
      manifest_item_id.Data4[2] = local_7c[2];
      manifest_item_id.Data4[3] = local_7c[3];
      manifest_item_id.Data4[4] = local_7c[4];
      manifest_item_id.Data4[5] = local_7c[5];
      manifest_item_id.Data4[6] = local_7c[6];
      manifest_item_id.Data4[7] = local_7c[7];
      parent_layer_id._0_8_ = local_74;
    }
    else {
      manifest_item_id.Data4[0] = local_5c[0];
      manifest_item_id.Data4[1] = local_5c[1];
      manifest_item_id.Data4[2] = local_5c[2];
      manifest_item_id.Data4[3] = local_5c[3];
      manifest_item_id.Data4[4] = local_5c[4];
      manifest_item_id.Data4[5] = local_5c[5];
      manifest_item_id.Data4[6] = local_5c[6];
      manifest_item_id.Data4[7] = local_5c[7];
      parent_layer_id.Data1 = manifest_item_id.Data1;
      parent_layer_id.Data2 = manifest_item_id.Data2;
      parent_layer_id.Data3 = manifest_item_id.Data3;
      _local_5c = OVar2;
    }
    OVar2.Data4 = (uchar  [8])parent_layer_id._0_8_;
    OVar2._0_8_ = manifest_item_id.Data4;
    SetParentLayerId(this,OVar2);
  }
  return (bool)(destination_material_index._3_1_ & 1);
}

Assistant:

bool ON_Layer::UpdateReferencedComponents(
  const class ON_ComponentManifest& source_manifest,
  const class ON_ComponentManifest& destination_manifest,
  const class ON_ManifestMap& manifest_map
  )
{
  bool rc = true;

  // Update render material reference
  int material_index = RenderMaterialIndex();
  if (material_index >= 0)
  {
    int destination_material_index = ON_UNSET_INT_INDEX;
    if (manifest_map.GetAndValidateDestinationIndex(
      ON_ModelComponent::Type::RenderMaterial,
      material_index,
      destination_manifest,
      &destination_material_index))
    {
      material_index = destination_material_index;
    }
    else
    {
      ON_ERROR("Unable to update render material reference.");
      rc = false;
      material_index = ON_Layer::Default.RenderMaterialIndex();
    }
    SetRenderMaterialIndex(material_index);
  }

  // Update line pattern reference
  int line_pattern_index = LinetypeIndex();
  if (line_pattern_index >= 0)
  {
    int destination_line_pattern_index = ON_UNSET_INT_INDEX;
    if (manifest_map.GetAndValidateDestinationIndex(
      ON_ModelComponent::Type::LinePattern,
      line_pattern_index,
      destination_manifest,
      &destination_line_pattern_index))
    {
      line_pattern_index = destination_line_pattern_index;
    }
    else
    {
      ON_ERROR("Unable to update line pattern reference.");
      rc = false;
      line_pattern_index = ON_Layer::Default.LinetypeIndex();
    }
    SetLinetypeIndex(line_pattern_index);
  }

  // Update parent layer reference
  ON_UUID parent_layer_id = ParentLayerId();
  if (ON_nil_uuid != parent_layer_id)
  {
    const ON_UUID manifest_item_id = destination_manifest.ItemFromId(
      ON_ModelComponent::Type::Layer,
      parent_layer_id
      ).Id();
    if ( ON_nil_uuid == manifest_item_id )
    {
      ON_ERROR("Unable to update parent layer id reference.");
      rc = false;
      parent_layer_id = ON_Layer::Default.ParentLayerId();
    }
    else
    {
      parent_layer_id = manifest_item_id;
    }
    SetParentLayerId(parent_layer_id);
  }

  return rc;
}